

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O3

void __thiscall SQArray::Finalize(SQArray *this)

{
  SQObjectPtr local_18;
  
  local_18.super_SQObject._type = OT_NULL;
  local_18.super_SQObject._unVal.pTable = (SQTable *)0x0;
  sqvector<SQObjectPtr>::resize(&this->_values,0,&local_18);
  SQObjectPtr::~SQObjectPtr(&local_18);
  return;
}

Assistant:

void Finalize(){
        _values.resize(0);
    }